

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

int ON_UuidIndex::CompareIndex(ON_UuidIndex *a,ON_UuidIndex *b)

{
  ON_UuidIndex *b_local;
  ON_UuidIndex *a_local;
  
  if (a == (ON_UuidIndex *)0x0) {
    a_local._4_4_ = 0;
    if (b != (ON_UuidIndex *)0x0) {
      a_local._4_4_ = -1;
    }
  }
  else if (b == (ON_UuidIndex *)0x0) {
    a_local._4_4_ = 1;
  }
  else if (a->m_i < b->m_i) {
    a_local._4_4_ = -1;
  }
  else if (b->m_i < a->m_i) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int ON_UuidIndex::CompareIndex( const ON_UuidIndex* a, const ON_UuidIndex* b )
{
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;
  if (a->m_i < b->m_i)
    return -1;
  if (a->m_i > b->m_i)
    return 1;
  return 0;
}